

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O0

DIST_POINT * crldp_from_section(X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  int iVar1;
  CONF_VALUE *pCVar2;
  X509 *pXVar3;
  int ret;
  CONF_VALUE *cnf;
  size_t i;
  DIST_POINT *point;
  stack_st_CONF_VALUE *nval_local;
  X509V3_CTX *ctx_local;
  
  ctx_local = (X509V3_CTX *)DIST_POINT_new();
  if (ctx_local == (X509V3_CTX *)0x0) {
LAB_004affd8:
    DIST_POINT_free((DIST_POINT *)ctx_local);
    ctx_local = (X509V3_CTX *)0x0;
  }
  else {
    for (cnf = (CONF_VALUE *)0x0; pCVar2 = (CONF_VALUE *)sk_CONF_VALUE_num(nval), cnf < pCVar2;
        cnf = (CONF_VALUE *)((long)&cnf->section + 1)) {
      pCVar2 = sk_CONF_VALUE_value(nval,(size_t)cnf);
      iVar1 = set_dist_point_name((DIST_POINT_NAME **)ctx_local,ctx,pCVar2);
      if (iVar1 < 1) {
        if (iVar1 < 0) goto LAB_004affd8;
        iVar1 = strcmp(pCVar2->name,"reasons");
        if (iVar1 == 0) {
          iVar1 = set_reasons((ASN1_BIT_STRING **)&ctx_local->issuer_cert,pCVar2->value);
          if (iVar1 == 0) goto LAB_004affd8;
        }
        else {
          iVar1 = strcmp(pCVar2->name,"CRLissuer");
          if (iVar1 == 0) {
            GENERAL_NAMES_free((GENERAL_NAMES *)ctx_local->subject_cert);
            pXVar3 = (X509 *)gnames_from_sectname(ctx,pCVar2->value);
            ctx_local->subject_cert = pXVar3;
            if (ctx_local->subject_cert == (X509 *)0x0) goto LAB_004affd8;
          }
        }
      }
    }
  }
  return (DIST_POINT *)ctx_local;
}

Assistant:

static DIST_POINT *crldp_from_section(const X509V3_CTX *ctx,
                                      const STACK_OF(CONF_VALUE) *nval) {
  DIST_POINT *point = NULL;
  point = DIST_POINT_new();
  if (!point) {
    goto err;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    int ret = set_dist_point_name(&point->distpoint, ctx, cnf);
    if (ret > 0) {
      continue;
    }
    if (ret < 0) {
      goto err;
    }
    if (!strcmp(cnf->name, "reasons")) {
      if (!set_reasons(&point->reasons, cnf->value)) {
        goto err;
      }
    } else if (!strcmp(cnf->name, "CRLissuer")) {
      GENERAL_NAMES_free(point->CRLissuer);
      point->CRLissuer = gnames_from_sectname(ctx, cnf->value);
      if (!point->CRLissuer) {
        goto err;
      }
    }
  }

  return point;

err:
  DIST_POINT_free(point);
  return NULL;
}